

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanImplX11.cpp
# Opt level: O3

bool sf::priv::VulkanImplX11::createVulkanSurface
               (VkInstance *instance,WindowHandle windowHandle,VkSurfaceKHR *surface,
               VkAllocationCallbacks *allocator)

{
  bool bVar1;
  int iVar2;
  code *pcVar3;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  Display *local_40;
  WindowHandle local_38;
  
  bVar1 = isAvailable(true);
  if ((bVar1) &&
     (pcVar3 = (code *)(*DAT_00287a80)(*instance,"vkCreateXlibSurfaceKHR"), pcVar3 != (code *)0x0))
  {
    uStack_50 = 0;
    local_48 = 0;
    local_58 = 0x3b9ad9a0;
    local_40 = OpenDisplay();
    local_38 = windowHandle;
    iVar2 = (*pcVar3)(*instance,&local_58,allocator,surface);
    CloseDisplay(local_40);
    return iVar2 == 0;
  }
  return false;
}

Assistant:

bool VulkanImplX11::createVulkanSurface(const VkInstance& instance, WindowHandle windowHandle, VkSurfaceKHR& surface, const VkAllocationCallbacks* allocator)
{
    if (!isAvailable())
        return false;

    // Make a copy of the instance handle since we get it passed as a reference
    VkInstance inst = instance;

    PFN_vkCreateXlibSurfaceKHR vkCreateXlibSurfaceKHR = reinterpret_cast<PFN_vkCreateXlibSurfaceKHR>(wrapper.vkGetInstanceProcAddr(inst, "vkCreateXlibSurfaceKHR"));

    if (!vkCreateXlibSurfaceKHR)
        return false;

    // Since the surface is basically attached to the window, the connection
    // to the X display will stay open even after we open and close it here
    VkXlibSurfaceCreateInfoKHR surfaceCreateInfo = VkXlibSurfaceCreateInfoKHR();
    surfaceCreateInfo.sType = VK_STRUCTURE_TYPE_XLIB_SURFACE_CREATE_INFO_KHR;
    surfaceCreateInfo.dpy = OpenDisplay();
    surfaceCreateInfo.window = windowHandle;

    bool result = (vkCreateXlibSurfaceKHR(instance, &surfaceCreateInfo, allocator, &surface) == VK_SUCCESS);

    CloseDisplay(surfaceCreateInfo.dpy);

    return result;
}